

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeSummary_Test::
~TextSerializerTest_shouldSerializeSummary_Test
          (TextSerializerTest_shouldSerializeSummary_Test *this)

{
  pointer pBVar1;
  pointer pQVar2;
  pointer pcVar3;
  
  (this->super_TextSerializerTest).super_Test._vptr_Test =
       (_func_int **)&PTR__TextSerializerTest_001b4398;
  pBVar1 = (this->super_TextSerializerTest).metric.histogram.bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1);
  }
  pQVar2 = (this->super_TextSerializerTest).metric.summary.quantile.
           super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pQVar2 != (pointer)0x0) {
    operator_delete(pQVar2);
  }
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector(&(this->super_TextSerializerTest).metric.label);
  pcVar3 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_TextSerializerTest).name.field_2) {
    operator_delete(pcVar3);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeSummary) {
  Summary summary{Summary::Quantiles{{0.5, 0.05}}};
  summary.Observe(0);
  summary.Observe(200);
  metric = summary.Collect();

  const auto serialized = Serialize(MetricType::Summary);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 200\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "{quantile=\"0.5\"} 0\n"));
}